

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_compression.cpp
# Opt level: O0

void compress_triangles_lz4(char *filename)

{
  int iVar1;
  ostream *poVar2;
  char *dst;
  uint uStack_1018c;
  uint uStack_1017c;
  uint uStack_1016c;
  uint uStack_10158;
  int bytes_written_3;
  uint8_t *compressed_buf_3;
  uint32_t estimateLen_3;
  LZ4_stream_t *lz4Stream_3;
  LZ4_stream_t lz4Stream_body_3;
  char *pcStack_c110;
  int bytes_written_2;
  uint8_t *compressed_buf_2;
  LZ4_stream_t **ppLStack_c100;
  uint32_t estimateLen_2;
  LZ4_stream_t *lz4Stream_2;
  LZ4_stream_t lz4Stream_body_2;
  char *pcStack_80d0;
  int bytes_written_1;
  uint8_t *compressed_buf_1;
  LZ4_stream_t **ppLStack_80c0;
  uint32_t estimateLen_1;
  LZ4_stream_t *lz4Stream_1;
  LZ4_stream_t lz4Stream_body_1;
  char *pcStack_4090;
  int bytes_written;
  uint8_t *compressed_buf;
  LZ4_stream_t **ppLStack_4080;
  uint32_t estimateLen;
  LZ4_stream_t *lz4Stream;
  LZ4_stream_t lz4Stream_body;
  uint8_t *puStack_50;
  uint32_t total_length;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  uint32_t *triangles;
  float *pfStack_20;
  uint32_t nr_of_triangles;
  float *vertices;
  char *pcStack_10;
  uint32_t nr_of_vertices;
  char *filename_local;
  
  pcStack_10 = filename;
  iVar1 = trico_read_stl((uint32_t *)((long)&vertices + 4),&stack0xffffffffffffffe0,
                         (uint32_t *)((long)&triangles + 4),(uint32_t **)&b1,filename);
  TestEq<int,int>(1,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
                  ,0x52,"void compress_triangles_lz4(const char *)");
  b2 = (uint8_t *)trico_malloc((ulong)(triangles._4_4_ * 3));
  b3 = (uint8_t *)trico_malloc((ulong)(triangles._4_4_ * 3));
  b4 = (uint8_t *)trico_malloc((ulong)(triangles._4_4_ * 3));
  puStack_50 = (uint8_t *)trico_malloc((ulong)(triangles._4_4_ * 3));
  trico_transpose_uint32_aos_to_soa
            (&b2,&b3,&b4,&stack0xffffffffffffffb0,(uint32_t *)b1,triangles._4_4_ * 3);
  lz4Stream_body.table[0x803]._4_4_ = 0;
  ppLStack_4080 = &lz4Stream;
  LZ4_initStream(ppLStack_4080,0x4020);
  if (triangles._4_4_ * 3 < 0x7e000001) {
    uStack_10158 = triangles._4_4_ * 3 + (triangles._4_4_ * 3) / 0xff + 0x10;
  }
  else {
    uStack_10158 = 0;
  }
  compressed_buf._4_4_ = uStack_10158;
  pcStack_4090 = (char *)operator_new__((ulong)uStack_10158);
  lz4Stream_body_1.table[0x803]._4_4_ =
       LZ4_compress_default((char *)b2,pcStack_4090,triangles._4_4_ * 3,compressed_buf._4_4_);
  lz4Stream_body.table[0x803]._4_4_ =
       lz4Stream_body.table[0x803]._4_4_ + lz4Stream_body_1.table[0x803]._4_4_;
  poVar2 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 for b1: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)triangles._4_4_ * 3.0) /
                             (float)(int)lz4Stream_body_1.table[0x803]._4_4_);
  std::operator<<(poVar2,"\n");
  if (pcStack_4090 != (char *)0x0) {
    operator_delete__(pcStack_4090);
  }
  ppLStack_80c0 = &lz4Stream_1;
  LZ4_initStream(ppLStack_80c0,0x4020);
  if (triangles._4_4_ * 3 < 0x7e000001) {
    uStack_1016c = triangles._4_4_ * 3 + (triangles._4_4_ * 3) / 0xff + 0x10;
  }
  else {
    uStack_1016c = 0;
  }
  compressed_buf_1._4_4_ = uStack_1016c;
  pcStack_80d0 = (char *)operator_new__((ulong)uStack_1016c);
  lz4Stream_body_2.table[0x803]._4_4_ =
       LZ4_compress_default((char *)b3,pcStack_80d0,triangles._4_4_ * 3,compressed_buf_1._4_4_);
  lz4Stream_body.table[0x803]._4_4_ =
       lz4Stream_body.table[0x803]._4_4_ + lz4Stream_body_2.table[0x803]._4_4_;
  poVar2 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 for b2: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)triangles._4_4_ * 3.0) /
                             (float)(int)lz4Stream_body_2.table[0x803]._4_4_);
  std::operator<<(poVar2,"\n");
  if (pcStack_80d0 != (char *)0x0) {
    operator_delete__(pcStack_80d0);
  }
  ppLStack_c100 = &lz4Stream_2;
  LZ4_initStream(ppLStack_c100,0x4020);
  if (triangles._4_4_ * 3 < 0x7e000001) {
    uStack_1017c = triangles._4_4_ * 3 + (triangles._4_4_ * 3) / 0xff + 0x10;
  }
  else {
    uStack_1017c = 0;
  }
  compressed_buf_2._4_4_ = uStack_1017c;
  pcStack_c110 = (char *)operator_new__((ulong)uStack_1017c);
  lz4Stream_body_3.table[0x803]._4_4_ =
       LZ4_compress_default((char *)b4,pcStack_c110,triangles._4_4_ * 3,compressed_buf_2._4_4_);
  lz4Stream_body.table[0x803]._4_4_ =
       lz4Stream_body.table[0x803]._4_4_ + lz4Stream_body_3.table[0x803]._4_4_;
  poVar2 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 for b3: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)triangles._4_4_ * 3.0) /
                             (float)(int)lz4Stream_body_3.table[0x803]._4_4_);
  std::operator<<(poVar2,"\n");
  if (pcStack_c110 != (char *)0x0) {
    operator_delete__(pcStack_c110);
  }
  LZ4_initStream(&lz4Stream_3,0x4020);
  if (triangles._4_4_ * 3 < 0x7e000001) {
    uStack_1018c = triangles._4_4_ * 3 + (triangles._4_4_ * 3) / 0xff + 0x10;
  }
  else {
    uStack_1018c = 0;
  }
  dst = (char *)operator_new__((ulong)uStack_1018c);
  iVar1 = LZ4_compress_default((char *)puStack_50,dst,triangles._4_4_ * 3,uStack_1018c);
  lz4Stream_body.table[0x803]._4_4_ = lz4Stream_body.table[0x803]._4_4_ + iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 for b4: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,((float)triangles._4_4_ * 3.0) / (float)iVar1)
  ;
  std::operator<<(poVar2,"\n");
  if (dst != (char *)0x0) {
    operator_delete__(dst);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Compression ratio lz4 total: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)triangles._4_4_ * 12.0) /
                             (float)(uint)lz4Stream_body.table[0x803]._4_4_);
  std::operator<<(poVar2,"\n");
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);
  trico_free(puStack_50);
  trico_free(pfStack_20);
  trico_free(b1);
  return;
}

Assistant:

void compress_triangles_lz4(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);

  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, triangles, nr_of_triangles * 3);

  uint32_t total_length = 0;
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b1: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b2: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b3: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }
  {
  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  auto estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = new uint8_t[estimateLen];

  int bytes_written = LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  total_length += bytes_written;
  std::cout << "Compression ratio lz4 for b4: " << ((float)nr_of_triangles * 3) / (float)bytes_written << "\n";

  delete[] compressed_buf;
  }

  std::cout << "Compression ratio lz4 total: " << ((float)nr_of_triangles*12.f) / (float)total_length << "\n";


  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);
  trico_free(vertices);
  trico_free(triangles);
  }